

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncodingTest.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  short *psVar1;
  short sVar2;
  XMLCh XVar3;
  int iVar4;
  DOMDocument *pDVar5;
  long *plVar6;
  wchar16 *pwVar7;
  long lVar8;
  XMLCh *pXVar9;
  ulong uVar10;
  ulong uVar11;
  short sVar12;
  char *pcVar13;
  XMLCh XVar14;
  long lVar15;
  bool bVar16;
  bool bVar17;
  XMLBuffer elData;
  XMLBuffer rawUData;
  char cFileName [4000];
  XMLCh tempStr_1 [4000];
  XMLCh tempStr [4000];
  ulong local_4f10;
  ulong local_4f08;
  undefined8 local_4f00;
  undefined1 local_4ef8;
  MemoryManager *local_4ef0;
  undefined8 local_4ee8;
  undefined2 *puStack_4ee0;
  XMLBuffer local_4ed8;
  XMLBuffer local_4ea0;
  long local_4e68;
  long *local_4e60;
  char local_4e58 [4000];
  wchar16 local_3eb8 [4000];
  wchar16 local_1f78 [4004];
  
  xercesc_4_0::XMLPlatformUtils::Initialize
            ((char *)&xercesc_4_0::XMLUni::fgXercescDefaultLocale,(char *)0x0,(PanicHandler *)0x0,
             (MemoryManager *)0x0);
  if (argc == 2) {
    pDVar5 = parseFile(argv[1]);
    if (pDVar5 != (DOMDocument *)0x0) {
      xercesc_4_0::XMLString::transcode
                ("testFile",local_1f78,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      local_4e60 = (long *)(**(code **)(*(long *)pDVar5 + 0x70))(pDVar5,local_1f78);
      local_4e68 = (**(code **)(*local_4e60 + 0x18))();
      if (local_4e68 != 0) {
        lVar15 = 0;
        do {
          gTestsRun = gTestsRun + 1;
          plVar6 = (long *)(**(code **)(*local_4e60 + 0x10))(local_4e60,lVar15);
          xercesc_4_0::XMLString::transcode
                    ("name",local_1f78,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
          pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x148))(plVar6,local_1f78);
          xercesc_4_0::XMLString::transcode
                    (pwVar7,local_4e58,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
          pDVar5 = parseFile(local_4e58);
          if (pDVar5 == (DOMDocument *)0x0) {
LAB_00102b3d:
            gTestsFailed = gTestsFailed + 1;
          }
          else {
            xercesc_4_0::XMLString::transcode
                      ("data",local_3eb8,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
            plVar6 = (long *)(**(code **)(*(long *)pDVar5 + 0x70))(pDVar5,local_3eb8);
            lVar8 = (**(code **)(*plVar6 + 0x18))(plVar6);
            if (lVar8 != 1) {
              fprintf(_stderr,"Test file \"%s\" must have exactly one \"data\" element.\n",
                      local_4e58);
              goto LAB_00102b3d;
            }
            plVar6 = (long *)(**(code **)(*plVar6 + 0x10))(plVar6,0);
            local_4ed8.fIndex = 0;
            local_4ed8.fCapacity = 0x3ff;
            local_4ed8.fFullSize = 0;
            local_4ed8.fUsed = false;
            local_4ed8.fMemoryManager = xercesc_4_0::XMLPlatformUtils::fgMemoryManager;
            local_4ed8.fFullHandler = (XMLBufferFullHandler *)0x0;
            local_4ed8.fBuffer = (XMLCh *)0x0;
            local_4ed8.fBuffer =
                 (XMLCh *)(**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager +
                                      0x18))(xercesc_4_0::XMLPlatformUtils::fgMemoryManager,0x800);
            *local_4ed8.fBuffer = L'\0';
            for (plVar6 = (long *)(**(code **)(*plVar6 + 0x38))(plVar6); plVar6 != (long *)0x0;
                plVar6 = (long *)(**(code **)(*plVar6 + 0x50))(plVar6)) {
              iVar4 = (**(code **)(*plVar6 + 0x20))(plVar6);
              if (iVar4 != 8) {
                iVar4 = (**(code **)(*plVar6 + 0x20))(plVar6);
                if (((iVar4 != 3) && (iVar4 = (**(code **)(*plVar6 + 0x20))(plVar6), iVar4 != 4)) &&
                   (iVar4 = (**(code **)(*plVar6 + 0x20))(plVar6), iVar4 != 5)) {
                  pcVar13 = "Test file \"%s\": data element contains unexpected children.";
                  goto LAB_00102b8e;
                }
                pXVar9 = (XMLCh *)(**(code **)(*plVar6 + 0x140))(plVar6);
                xercesc_4_0::XMLBuffer::append(&local_4ed8,pXVar9);
              }
            }
            xercesc_4_0::XMLString::transcode
                      ("udata",local_3eb8,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
            plVar6 = (long *)(**(code **)(*(long *)pDVar5 + 0x70))(pDVar5,local_3eb8);
            lVar8 = (**(code **)(*plVar6 + 0x18))(plVar6);
            if (lVar8 == 1) {
              plVar6 = (long *)(**(code **)(*plVar6 + 0x10))(plVar6,0);
              local_4ea0.fIndex = 0;
              local_4ea0.fCapacity = 0x3ff;
              local_4ea0.fFullSize = 0;
              local_4ea0.fUsed = false;
              local_4ea0.fMemoryManager = xercesc_4_0::XMLPlatformUtils::fgMemoryManager;
              local_4ea0.fFullHandler = (XMLBufferFullHandler *)0x0;
              local_4ea0.fBuffer = (XMLCh *)0x0;
              local_4ea0.fBuffer =
                   (XMLCh *)(**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager +
                                        0x18))(xercesc_4_0::XMLPlatformUtils::fgMemoryManager,0x800)
              ;
              *local_4ea0.fBuffer = L'\0';
              for (plVar6 = (long *)(**(code **)(*plVar6 + 0x38))(plVar6); plVar6 != (long *)0x0;
                  plVar6 = (long *)(**(code **)(*plVar6 + 0x50))(plVar6)) {
                iVar4 = (**(code **)(*plVar6 + 0x20))(plVar6);
                if (iVar4 != 8) {
                  iVar4 = (**(code **)(*plVar6 + 0x20))(plVar6);
                  if (((iVar4 != 3) && (iVar4 = (**(code **)(*plVar6 + 0x20))(plVar6), iVar4 != 4))
                     && (iVar4 = (**(code **)(*plVar6 + 0x20))(plVar6), iVar4 != 5)) {
                    bVar16 = false;
                    fprintf(_stderr,"Test file \"%s\": udata element contains unexpected children.",
                            local_4e58);
                    goto LAB_00102b12;
                  }
                  pXVar9 = (XMLCh *)(**(code **)(*plVar6 + 0x140))(plVar6);
                  xercesc_4_0::XMLBuffer::append(&local_4ea0,pXVar9);
                }
              }
              local_4f10 = 0;
              local_4f08 = 0x3ff;
              local_4f00 = 0;
              local_4ef8 = 0;
              local_4ef0 = xercesc_4_0::XMLPlatformUtils::fgMemoryManager;
              local_4ee8 = 0;
              puStack_4ee0 = (undefined2 *)0x0;
              puStack_4ee0 = (undefined2 *)
                             (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager +
                                         0x18))(xercesc_4_0::XMLPlatformUtils::fgMemoryManager,0x800
                                               );
              *puStack_4ee0 = 0;
              if (local_4ea0.fIndex != 0) {
                uVar10 = 0;
                do {
                  local_4ea0.fBuffer[local_4ea0.fIndex] = L'\0';
                  uVar11 = 0;
                  if (local_4ea0.fBuffer != (XMLCh *)0x0) {
                    do {
                      psVar1 = (short *)((long)local_4ea0.fBuffer + uVar11);
                      uVar11 = uVar11 + 2;
                    } while (*psVar1 != 0);
                    uVar11 = ((long)uVar11 >> 1) - 1;
                  }
                  while (((uVar10 < uVar11 && ((ulong)(ushort)local_4ea0.fBuffer[uVar10] < 0x21)) &&
                         ((0x100000600U >> ((ulong)(ushort)local_4ea0.fBuffer[uVar10] & 0x3f) & 1)
                          != 0))) {
                    uVar10 = (ulong)((int)uVar10 + 1);
                  }
                  local_4ea0.fBuffer[local_4ea0.fIndex] = L'\0';
                  uVar11 = 0;
                  if (local_4ea0.fBuffer != (XMLCh *)0x0) {
                    do {
                      psVar1 = (short *)((long)local_4ea0.fBuffer + uVar11);
                      uVar11 = uVar11 + 2;
                    } while (*psVar1 != 0);
                    uVar11 = ((long)uVar11 >> 1) - 1;
                  }
                  sVar12 = 0;
                  do {
                    if (uVar11 <= uVar10) break;
                    XVar3 = local_4ea0.fBuffer[uVar10];
                    XVar14 = XVar3 + L'￠';
                    if (5 < (ushort)(XVar3 + L'ﾟ')) {
                      XVar14 = XVar3;
                    }
                    bVar16 = (ushort)(XVar14 + L'￐') < 0x17;
                    bVar17 = (ushort)(XVar14 + L'﾿') < 0xfff9;
                    if (bVar17 && bVar16) {
                      sVar2 = sVar12 * 0x10 + -0x37;
                      if ((ushort)XVar14 < 0x3a) {
                        sVar2 = sVar12 * 0x10 + -0x30;
                      }
                      sVar12 = sVar2 + XVar14;
                      uVar10 = (ulong)((int)uVar10 + 1);
                    }
                  } while (bVar17 && bVar16);
                  if (sVar12 == 0) {
                    if (uVar10 < local_4ea0.fIndex) {
                      bVar16 = false;
                      fprintf(_stderr,
                              "Test file \"%s\": Bad hex number in udata element.  Data character number %llu\n"
                              ,local_4e58,local_4f10);
                      goto LAB_00102b02;
                    }
                  }
                  else {
                    if (local_4f10 == local_4f08) {
                      xercesc_4_0::XMLBuffer::ensureCapacity((ulong)&local_4f10);
                    }
                    puStack_4ee0[local_4f10] = sVar12;
                    local_4f10 = local_4f10 + 1;
                  }
                } while (uVar10 < local_4ea0.fIndex);
              }
              pXVar9 = local_4ed8.fBuffer;
              if (local_4ed8.fIndex == 0) {
                uVar10 = 0;
              }
              else {
                uVar10 = 0;
                do {
                  local_4ed8.fBuffer[local_4ed8.fIndex] = L'\0';
                  puStack_4ee0[local_4f10] = 0;
                  if (local_4f10 <= uVar10) {
                    pcVar13 = 
                    "Test file \"%s\": udata element shorter than data at char number %d\n";
LAB_00102bfb:
                    fprintf(_stderr,pcVar13,local_4e58);
                    goto LAB_00102c0d;
                  }
                  if (puStack_4ee0[uVar10] != local_4ed8.fBuffer[uVar10]) {
                    pcVar13 = "Test file \"%s\": comparison failure at character number %d\n";
                    goto LAB_00102bfb;
                  }
                  uVar10 = (ulong)((int)uVar10 + 1);
                } while (uVar10 < local_4ed8.fIndex);
              }
              bVar16 = true;
              if (local_4ed8.fIndex != local_4f10) {
                fprintf(_stderr,
                        "Test file \"%s\": udata element longer than data at char number %d\n",
                        local_4e58,uVar10);
                local_4ed8.fBuffer[local_4ed8.fIndex] = L'\0';
                pXVar9 = local_4ed8.fBuffer;
LAB_00102c0d:
                bVar16 = false;
                writeUData(pXVar9);
              }
LAB_00102b02:
              (**(code **)(*(long *)local_4ef0 + 0x20))(local_4ef0,puStack_4ee0);
LAB_00102b12:
              (**(code **)(*(long *)local_4ea0.fMemoryManager + 0x20))
                        (local_4ea0.fMemoryManager,local_4ea0.fBuffer);
            }
            else {
              pcVar13 = "Test file \"%s\" must have exactly one \"udata\" element.\n";
LAB_00102b8e:
              bVar16 = false;
              fprintf(_stderr,pcVar13,local_4e58);
            }
            (**(code **)(*(long *)local_4ed8.fMemoryManager + 0x20))
                      (local_4ed8.fMemoryManager,local_4ed8.fBuffer);
            if (!bVar16) goto LAB_00102b3d;
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 != local_4e68);
      }
      printf("Encoding Tests Results Summary: \n   %d encoding tests run.\n   %d tests passed,\n   %d tests failed\n"
             ,(ulong)(uint)gTestsRun,(ulong)(uint)(gTestsRun - gTestsFailed));
      if (parser != (XercesDOMParser *)0x0) {
        (**(code **)(*(long *)parser + 8))();
      }
      parser = (XercesDOMParser *)0x0;
      return 0;
    }
  }
  else {
    printf("usage: %s file_name \n   where file name is the xml file specifying the list of test files."
           ,*argv);
  }
  return 1;
}

Assistant:

int main(int argc, char ** argv) {

   //
    // Initialize the Xerces-c environment
    //
	try
    {
        XMLPlatformUtils::Initialize();
    }

    catch (const XMLException& toCatch)
    {
        fprintf(stderr, "Error during initialization of xerces-c: %s\n",
            XMLString::transcode(toCatch.getMessage()));
         return 1;
    }

    //
    // Parse the command line, which should specify exactly one file, which is an
    //   xml file containing the list of test files to be processed.
    //
    if (argc != 2) {
        printf("usage: %s file_name \n"
               "   where file name is the xml file specifying the list of test files.", argv[0]);
        return 1;
    }
    DOMDocument* fileListDoc = parseFile(argv[1]);
    if (fileListDoc == 0) return 1;


    //
    // Iterate over the list of files, running each as a test.
    //
    XMLCh tempStr[4000];
    XMLString::transcode("testFile", tempStr, 3999);
    DOMNodeList* list = fileListDoc->getElementsByTagName(tempStr);
    XMLSize_t i;
    XMLSize_t numFiles = list->getLength();
    for (i=0; i<numFiles; i++)
    {
        ++gTestsRun;
        DOMNode* tmpNode3 = list->item(i);
        XMLString::transcode("name", tempStr, 3999);
        const XMLCh* fileName = ((DOMElement*) tmpNode3)->getAttribute(tempStr);
        if (processTestFile(fileName) == false)
            ++gTestsFailed;
    };



    //
    // We are done.  Print out a summary of the results
    //
    printf("Encoding Tests Results Summary: \n"
           "   %d encoding tests run.\n"
           "   %d tests passed,\n"
           "   %d tests failed\n", gTestsRun, gTestsRun-gTestsFailed, gTestsFailed);

    delete parser;
    parser = 0;
   return 0;
}